

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  byte bVar1;
  int iVar2;
  char cVar3;
  BYTE BVar4;
  size_t rankValOrigin;
  DTableDesc DVar5;
  uint targetLog;
  uint uVar6;
  HUF_DEltX2 *DTable_00;
  U32 *pUVar7;
  HUF_DTable *code;
  uint local_bc;
  U32 w_3;
  U32 *rankValPtr;
  U32 consumed;
  U32 minBits;
  U32 curr_1;
  U32 w_2;
  U32 nextRankVal;
  int rescale;
  U32 *rankVal0;
  U32 r;
  U32 w_1;
  U32 s;
  U32 curr;
  U32 nextRankStart;
  U32 w;
  HUF_ReadDTableX2_Workspace *wksp;
  U32 *rankStart;
  HUF_DEltX2 *dt;
  void *dtPtr;
  size_t iSize;
  U32 maxTableLog;
  DTableDesc dtd;
  U32 nbSymbols;
  U32 sizeOfSort;
  U32 maxW;
  U32 tableLog;
  size_t wkspSize_local;
  void *workSpace_local;
  size_t srcSize_local;
  void *src_local;
  HUF_DTable *DTable_local;
  
  _maxW = wkspSize;
  wkspSize_local = (size_t)workSpace;
  workSpace_local = (void *)srcSize;
  srcSize_local = (size_t)src;
  src_local = DTable;
  DVar5 = HUF_getDTableDesc(DTable);
  rankValOrigin = wkspSize_local;
  targetLog = (uint)DVar5 & 0xff;
  DTable_00 = (HUF_DEltX2 *)((long)src_local + 4);
  if (_maxW < 0x944) {
    DTable_local = (HUF_DTable *)0xffffffffffffffff;
  }
  else {
    pUVar7 = (U32 *)(wkspSize_local + 0x2a8);
    memset((void *)(wkspSize_local + 0x270),0,0x34);
    memset((void *)(rankValOrigin + 0x2a4),0,0x38);
    if (targetLog < 0xd) {
      code = (HUF_DTable *)
             HUF_readStats_wksp((BYTE *)(rankValOrigin + 0x4dc),0x100,(U32 *)(rankValOrigin + 0x270)
                                ,&maxTableLog,&sizeOfSort,(void *)srcSize_local,
                                (size_t)workSpace_local,(void *)(rankValOrigin + 0x5dc),0x368,0);
      uVar6 = ERR_isError((size_t)code);
      DTable_local = code;
      if (uVar6 == 0) {
        if (targetLog < sizeOfSort) {
          DTable_local = (HUF_DTable *)0xffffffffffffffd4;
        }
        else {
          nbSymbols = sizeOfSort;
          while (*(int *)(rankValOrigin + 0x270 + (ulong)nbSymbols * 4) == 0) {
            nbSymbols = nbSymbols - 1;
          }
          s = 0;
          for (curr = 1; curr < nbSymbols + 1; curr = curr + 1) {
            iVar2 = *(int *)(rankValOrigin + 0x270 + (ulong)curr * 4);
            pUVar7[curr] = s;
            s = iVar2 + s;
          }
          *pUVar7 = s;
          dtd.maxTableLog = (undefined1)s;
          dtd.tableType = s._1_1_;
          dtd.tableLog = s._2_1_;
          dtd.reserved = s._3_1_;
          for (r = 0; r < maxTableLog; r = r + 1) {
            bVar1 = *(byte *)(rankValOrigin + 0x4dc + (ulong)r);
            uVar6 = pUVar7[bVar1];
            pUVar7[bVar1] = uVar6 + 1;
            *(char *)(rankValOrigin + 0x2dc + (ulong)uVar6 * 2) = (char)r;
            *(byte *)(rankValOrigin + 0x2dd + (ulong)uVar6 * 2) = bVar1;
          }
          *pUVar7 = 0;
          BVar4 = DVar5.maxTableLog;
          curr_1 = 0;
          for (minBits = 1; minBits < nbSymbols + 1; minBits = minBits + 1) {
            iVar2 = *(int *)(rankValOrigin + 0x270 + (ulong)minBits * 4);
            cVar3 = (char)minBits;
            *(U32 *)(rankValOrigin + (ulong)minBits * 4) = curr_1;
            curr_1 = (iVar2 << (cVar3 + (BVar4 - (char)sizeOfSort) + -1 & 0x1f)) + curr_1;
          }
          uVar6 = (sizeOfSort + 1) - nbSymbols;
          for (rankValPtr._0_4_ = uVar6; (uint)rankValPtr < (targetLog - uVar6) + 1;
              rankValPtr._0_4_ = (uint)rankValPtr + 1) {
            for (local_bc = 1; local_bc < nbSymbols + 1; local_bc = local_bc + 1) {
              *(uint *)(rankValOrigin + (ulong)(uint)rankValPtr * 0x34 + (ulong)local_bc * 4) =
                   *(uint *)(rankValOrigin + (ulong)local_bc * 4) >> ((byte)(uint)rankValPtr & 0x1f)
              ;
            }
          }
          HUF_fillDTableX2(DTable_00,targetLog,(sortedSymbol_t *)(rankValOrigin + 0x2dc),s,
                           (U32 *)(rankValOrigin + 0x2a4),(rankValCol_t *)rankValOrigin,nbSymbols,
                           sizeOfSort + 1,(U32 *)(rankValOrigin + 0x5dc),0xda);
          iSize._7_1_ = DVar5.reserved;
          iSize._4_4_ = CONCAT22(CONCAT11(iSize._7_1_,BVar4),CONCAT11(1,BVar4));
          *(undefined4 *)src_local = iSize._4_4_;
        }
      }
    }
    else {
      DTable_local = (HUF_DTable *)0xffffffffffffffd4;
    }
  }
  return (size_t)DTable_local;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize)
{
    U32 tableLog, maxW, sizeOfSort, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 const maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    HUF_ReadDTableX2_Workspace* const wksp = (HUF_ReadDTableX2_Workspace*)workSpace;

    if (sizeof(*wksp) > wkspSize) return ERROR(GENERIC);

    rankStart = wksp->rankStart0 + 1;
    ZSTD_memset(wksp->rankStats, 0, sizeof(wksp->rankStats));
    ZSTD_memset(wksp->rankStart0, 0, sizeof(wksp->rankStart0));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* ZSTD_memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->weightList, HUF_SYMBOLVALUE_MAX + 1, wksp->rankStats, &nbSymbols, &tableLog, src, srcSize, wksp->calleeWksp, sizeof(wksp->calleeWksp), /* bmi2 */ 0);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */

    /* find maxWeight */
    for (maxW = tableLog; wksp->rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 curr = nextRankStart;
            nextRankStart += wksp->rankStats[w];
            rankStart[w] = curr;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        sizeOfSort = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = wksp->weightList[s];
            U32 const r = rankStart[w]++;
            wksp->sortedSymbol[r].symbol = (BYTE)s;
            wksp->sortedSymbol[r].weight = (BYTE)w;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = wksp->rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 curr = nextRankVal;
                nextRankVal += wksp->rankStats[w] << (w+rescale);
                rankVal0[w] = curr;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = wksp->rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   wksp->sortedSymbol, sizeOfSort,
                   wksp->rankStart0, wksp->rankVal, maxW,
                   tableLog+1,
                   wksp->calleeWksp, sizeof(wksp->calleeWksp) / sizeof(U32));

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}